

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

void Ndr_NtkPrintNodes(Wlc_Ntk_t *pNtk)

{
  ushort uVar1;
  uint uVar2;
  Wlc_Obj_t *p;
  int *piVar3;
  ulong uVar4;
  uint Id;
  
  puts("Node IDs and their fanins:");
  for (Id = 1; (int)Id < pNtk->iObj; Id = Id + 1) {
    p = Wlc_NtkObj(pNtk,Id);
    piVar3 = Wlc_ObjFanins(p);
    printf("%5d = ",(ulong)Id);
    for (uVar4 = 0; (long)uVar4 < (long)(int)p->nFanins; uVar4 = uVar4 + 1) {
      printf("%5d ",(ulong)(uint)piVar3[uVar4]);
    }
    for (; (uint)uVar4 < 4; uVar4 = (ulong)((uint)uVar4 + 1)) {
      printf("      ");
    }
    uVar2 = Vec_IntEntry(&pNtk->vNameIds,Id);
    printf("    Name Id %d ",(ulong)uVar2);
    uVar1 = *(ushort *)p;
    if ((uVar1 & 0x3f) == 1) {
      printf("  pi  ");
      uVar1 = *(ushort *)p;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      printf("  po  ");
    }
    putchar(10);
  }
  return;
}

Assistant:

void Ndr_NtkPrintNodes( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; int i, k;
    printf( "Node IDs and their fanins:\n" );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        printf( "%5d = ", i );
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            printf( "%5d ", pFanins[k] );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wlc_ObjNameId(pNtk, i) );
        if ( Wlc_ObjIsPi(pObj) )
            printf( "  pi  " );
        if ( Wlc_ObjIsPo(pObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}